

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O1

void LoadActors(void)

{
  int iVar1;
  FStateTempCall *pFVar2;
  FState *pFVar3;
  BYTE *pBVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VMScriptFunction *pVVar8;
  PPrototype *pPVar9;
  long *plVar10;
  PClassActor *pPVar11;
  long lVar12;
  uint uVar13;
  char *pcVar14;
  char *format;
  ulong uVar15;
  double dVar16;
  int lastlump;
  TArray<PType_*,_PType_*> args;
  FCompileContext ctx;
  timespec ts;
  char label [64];
  FILE *local_1f0;
  int local_1d4;
  double local_1d0;
  TArray<PType_*,_PType_*> local_1c8;
  FCompileContext local_1b8;
  VMFunctionBuilder local_198;
  FCompileContext local_78 [2];
  FxExpression *pFVar7;
  undefined4 extraout_var_01;
  
  clock_gettime(1,(timespec *)&local_198);
  if (ActorDamageFuncs.super_TArray<FxExpression_*,_FxExpression_*>.Count != 0) {
    ActorDamageFuncs.super_TArray<FxExpression_*,_FxExpression_*>.Count = 0;
  }
  dVar16 = (double)(long)local_198.Registers[0].Used._8_8_;
  local_1d0 = (double)(long)local_198.Registers[0].Used._0_8_;
  FScriptPosition::ErrorCounter = 0;
  InitThingdef();
  local_1d4 = 0;
  iVar5 = FWadCollection::FindLump(&Wads,"DECORATE",&local_1d4,false);
  if (iVar5 != -1) {
    do {
      FScanner::FScanner((FScanner *)&local_198,iVar5);
      ParseDecorate((FScanner *)&local_198);
      FScanner::~FScanner((FScanner *)&local_198);
      iVar5 = FWadCollection::FindLump(&Wads,"DECORATE",&local_1d4,false);
    } while (iVar5 != -1);
  }
  iVar5 = DArgs::CheckParm(Args,"-dumpdisasm",1);
  if (iVar5 == 0) {
    local_1f0 = (FILE *)0x0;
  }
  else {
    local_1f0 = fopen("disasm.txt","w");
  }
  iVar5 = 0;
  if (StateTempCalls.super_TArray<FStateTempCall_*,_FStateTempCall_*>.Count != 0) {
    uVar15 = 0;
    iVar5 = 0;
    do {
      pFVar2 = StateTempCalls.super_TArray<FStateTempCall_*,_FStateTempCall_*>.Array[uVar15];
      if (pFVar2->Code == (FxExpression *)0x0) {
        __assert_fail("tcall->Code != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef.cpp"
                      ,0x113,"void FinishThingdef()");
      }
      FCompileContext::FCompileContext(&local_1b8,pFVar2->ActorClass,(PPrototype *)0x0);
      iVar6 = (*pFVar2->Code->_vptr_FxExpression[2])(pFVar2->Code,&local_1b8);
      pFVar7 = (FxExpression *)CONCAT44(extraout_var,iVar6);
      pFVar2->Code = pFVar7;
      pFVar2->Proto = local_1b8.ReturnProto;
      if (pFVar7 != (FxExpression *)0x0) {
        iVar6 = (*pFVar7->_vptr_FxExpression[6])(pFVar7);
        pVVar8 = (VMScriptFunction *)CONCAT44(extraout_var_00,iVar6);
        if (pVVar8 == (VMScriptFunction *)0x0) {
          VMFunctionBuilder::VMFunctionBuilder(&local_198);
          if (pFVar2->Proto == (PPrototype *)0x0) {
            __assert_fail("tcall->Proto != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef.cpp"
                          ,0x125,"void FinishThingdef()");
          }
          VMFunctionBuilder::RegAvailability::Get(local_198.Registers + 3,3);
          (*pFVar2->Code->_vptr_FxExpression[7])(pFVar2->Code,&local_198);
          pVVar8 = VMFunctionBuilder::MakeFunction(&local_198);
          pVVar8->NumArgs = '\x03';
          local_1c8.Most = 3;
          local_1c8.Count = 0;
          local_1c8.Array =
               (PType **)
               M_Malloc_Dbg(0x18,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                            ,0x91);
          SetImplicitArgs(&local_1c8,(TArray<unsigned_int,_unsigned_int> *)0x0,pFVar2->ActorClass,6)
          ;
          pPVar9 = NewPrototype(&pFVar2->Proto->ReturnTypes,&local_1c8);
          (pVVar8->super_VMFunction).Proto = pPVar9;
          if (local_1f0 != (FILE *)0x0) {
            iVar6 = mysnprintf((char *)local_78,0x40,"Function %s.States[%d] (*%d)",
                               FName::NameData.NameArray
                               [(pFVar2->ActorClass->super_PClass).super_PStruct.super_PNamedType.
                                TypeName.Index].Text,(ulong)(uint)pFVar2->FirstState,
                               (ulong)(uint)pFVar2->NumStates);
            DumpFunction((FILE *)local_1f0,pVVar8,(char *)local_78,iVar6);
            iVar5 = iVar5 + pVVar8->CodeSize;
          }
          TArray<PType_*,_PType_*>::~TArray(&local_1c8);
          VMFunctionBuilder::~VMFunctionBuilder(&local_198);
        }
        if (pFVar2->Code != (FxExpression *)0x0) {
          (*pFVar2->Code->_vptr_FxExpression[1])();
        }
        pFVar2->Code = (FxExpression *)0x0;
        iVar6 = pFVar2->NumStates;
        if (0 < (long)iVar6) {
          pFVar3 = pFVar2->ActorClass->OwnedStates;
          iVar1 = pFVar2->FirstState;
          lVar12 = 0;
          do {
            *(VMScriptFunction **)((long)&pFVar3[iVar1].ActionFunc + lVar12) = pVVar8;
            lVar12 = lVar12 + 0x28;
          } while ((long)iVar6 * 0x28 != lVar12);
        }
      }
      TArray<FxJumpStatement_*,_FxJumpStatement_*>::~TArray(&local_1b8.Jumps);
      uVar15 = uVar15 + 1;
    } while (uVar15 < StateTempCalls.super_TArray<FStateTempCall_*,_FStateTempCall_*>.Count);
  }
  if (PClassActor::AllActorClasses.Count == 0) {
    uVar13 = 0;
  }
  else {
    uVar15 = 0;
    uVar13 = 0;
    do {
      pPVar11 = PClassActor::AllActorClasses.Array[uVar15];
      if (*(int *)&(pPVar11->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                   super_PType.super_DObject.field_0x24 == -1) {
        pcVar14 = FName::NameData.NameArray
                  [(pPVar11->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text;
        format = "\x1cGClass %s referenced but not defined\n";
LAB_0063de4d:
        Printf(format,pcVar14);
        uVar13 = uVar13 + 1;
      }
      else {
        pBVar4 = (pPVar11->super_PClass).Defaults;
        if (pBVar4 == (BYTE *)0x0) {
          pcVar14 = FName::NameData.NameArray
                    [(pPVar11->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text;
          format = "\x1cGNo ActorInfo defined for class \'%s\'\n";
          goto LAB_0063de4d;
        }
        if (*(long *)(pBVar4 + 0x180) != 0) {
          pFVar7 = ActorDamageFuncs.super_TArray<FxExpression_*,_FxExpression_*>.Array
                   [*(long *)(pBVar4 + 0x180) + -1];
          pVVar8 = *(VMScriptFunction **)&pFVar7[1].JumpAddresses.Most;
          if (pVVar8 == (VMScriptFunction *)0x0) {
            FCompileContext::FCompileContext(local_78,pPVar11,(PPrototype *)0x0);
            iVar6 = (*pFVar7->_vptr_FxExpression[2])(pFVar7,local_78);
            plVar10 = (long *)CONCAT44(extraout_var_01,iVar6);
            if (plVar10 == (long *)0x0) {
              pVVar8 = (VMScriptFunction *)0x0;
            }
            else {
              VMFunctionBuilder::VMFunctionBuilder(&local_198);
              VMFunctionBuilder::RegAvailability::Get(local_198.Registers + 3,1);
              (**(code **)(*plVar10 + 0x38))(plVar10,&local_198);
              pVVar8 = VMFunctionBuilder::MakeFunction(&local_198);
              pVVar8->NumArgs = '\x01';
              (pVVar8->super_VMFunction).Proto = (PPrototype *)0x0;
              plVar10[9] = (long)pVVar8;
              VMFunctionBuilder::~VMFunctionBuilder(&local_198);
            }
            TArray<FxJumpStatement_*,_FxJumpStatement_*>::~TArray(&local_78[0].Jumps);
          }
          *(VMScriptFunction **)(pBVar4 + 0x180) = pVVar8;
          if ((local_1f0 != (FILE *)0x0) && (pVVar8 != (VMScriptFunction *)0x0)) {
            iVar6 = mysnprintf((char *)&local_198,0x40,"Function %s.Damage",
                               FName::NameData.NameArray
                               [(pPVar11->super_PClass).super_PStruct.super_PNamedType.TypeName.
                                Index].Text);
            DumpFunction((FILE *)local_1f0,pVVar8,(char *)&local_198,iVar6);
            iVar5 = iVar5 + pVVar8->CodeSize;
          }
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < PClassActor::AllActorClasses.Count);
  }
  if (local_1f0 != (FILE *)0x0) {
    fprintf(local_1f0,
            "\n*************************************************************************\n%i code bytes\n"
            ,(ulong)(uint)(iVar5 << 2));
    fclose(local_1f0);
  }
  dVar16 = dVar16 * 1e-09 + local_1d0;
  if (0 < (int)uVar13) {
    I_Error("%d errors during actor postprocessing",(ulong)uVar13);
  }
  TDeletingArray<FxExpression_*,_FxExpression_*>::DeleteAndClear(&ActorDamageFuncs);
  TDeletingArray<FStateTempCall_*,_FStateTempCall_*>::DeleteAndClear(&StateTempCalls);
  uVar15 = 1;
  lVar12 = 0;
  do {
    mysnprintf((char *)&local_198,0x14,"QuestItem%d",uVar15);
    pPVar11 = PClass::FindActor((char *)&local_198);
    *(PClassActor **)((long)QuestItemClasses + lVar12) = pPVar11;
    lVar12 = lVar12 + 8;
    uVar15 = (ulong)((int)uVar15 + 1);
  } while (lVar12 != 0xf8);
  if (0 < FScriptPosition::ErrorCounter) {
    I_Error("%d errors while parsing DECORATE scripts");
  }
  clock_gettime(1,(timespec *)&local_198);
  if (batchrun == false) {
    Printf("DECORATE parsing took %.2f ms\n",
           ((0.0 - dVar16) +
           (double)(long)local_198.Registers[0].Used._0_8_ +
           (double)(long)local_198.Registers[0].Used._8_8_ * 1e-09) * 1000.0);
  }
  return;
}

Assistant:

void LoadActors ()
{
	int lastlump, lump;
	cycle_t timer;

	timer.Reset(); timer.Clock();
	ActorDamageFuncs.Clear();
	FScriptPosition::ResetErrorCounter();
	InitThingdef();
	lastlump = 0;
	while ((lump = Wads.FindLump ("DECORATE", &lastlump)) != -1)
	{
		FScanner sc(lump);
		ParseDecorate (sc);
	}
	FinishThingdef();
	if (FScriptPosition::ErrorCounter > 0)
	{
		I_Error("%d errors while parsing DECORATE scripts", FScriptPosition::ErrorCounter);
	}
	timer.Unclock();
	if (!batchrun) Printf("DECORATE parsing took %.2f ms\n", timer.TimeMS());
	// Base time: ~52 ms
}